

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluShaderLibrary.cpp
# Opt level: O2

deUint32 __thiscall glu::sl::ShaderParser::parseShaderStageList(ShaderParser *this)

{
  deUint32 dVar1;
  deUint32 dVar2;
  undefined8 extraout_RAX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_38;
  
  assumeToken(this,TOKEN_LEFT_BRACE);
  advanceToken(this);
  dVar1 = getShaderStageLiteralFlag(this);
  while( true ) {
    advanceToken(this);
    if (this->m_curToken != TOKEN_COMMA) break;
    advanceToken(this);
    dVar2 = getShaderStageLiteralFlag(this);
    if ((dVar2 & dVar1) != 0) goto LAB_004f2a27;
    dVar1 = dVar1 | dVar2;
  }
  if (this->m_curToken == TOKEN_RIGHT_BRACE) {
    advanceToken(this,TOKEN_RIGHT_BRACE);
    return dVar1;
  }
  std::operator+(&bStack_38,"invalid shader stage set token: ",&this->m_curTokenStr);
  parseError(this,&bStack_38);
LAB_004f2a27:
  std::operator+(&bStack_38,"stage already set in the shader stage set: ",&this->m_curTokenStr);
  parseError(this,&bStack_38);
  std::__cxx11::string::~string((string *)&bStack_38);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

deUint32 ShaderParser::parseShaderStageList (void)
{
	deUint32 mask = 0;

	assumeToken(TOKEN_LEFT_BRACE);

	// don't allow 0-sized lists
	advanceToken();
	mask |= getShaderStageLiteralFlag();
	advanceToken();

	for (;;)
	{
		if (m_curToken == TOKEN_RIGHT_BRACE)
			break;
		else if (m_curToken == TOKEN_COMMA)
		{
			deUint32 stageFlag;
			advanceToken();

			stageFlag = getShaderStageLiteralFlag();
			if (stageFlag & mask)
				parseError(string("stage already set in the shader stage set: " + m_curTokenStr));

			mask |= stageFlag;
			advanceToken();
		}
		else
			parseError(string("invalid shader stage set token: " + m_curTokenStr));
	}
	advanceToken(TOKEN_RIGHT_BRACE);

	return mask;
}